

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void tree_sitter_bash_external_scanner_destroy(void *payload)

{
  void *pvVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0x18;
  for (uVar2 = 0; uVar2 < *(uint *)((long)payload + 0x10); uVar2 = uVar2 + 1) {
    pvVar1 = ((Array *)((long)payload + 8))->contents;
    _array__delete((Array *)(lVar3 + (long)pvVar1));
    _array__delete((Array *)((long)pvVar1 + lVar3 + -0x10));
    lVar3 = lVar3 + 0x28;
  }
  _array__delete((Array *)((long)payload + 8));
  free(payload);
  return;
}

Assistant:

void tree_sitter_bash_external_scanner_destroy(void *payload) {
    Scanner *scanner = (Scanner *)payload;
    for (size_t i = 0; i < scanner->heredocs.size; i++) {
        Heredoc *heredoc = array_get(&scanner->heredocs, i);
        array_delete(&heredoc->current_leading_word);
        array_delete(&heredoc->delimiter);
    }
    array_delete(&scanner->heredocs);
    free(scanner);
}